

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_GetOrderedByLevels::_Run(_Test_GetOrderedByLevels *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  DB *pDVar3;
  undefined1 local_241;
  string local_240;
  Status local_220;
  string local_218;
  undefined1 local_1f8 [40];
  FilterPolicy *local_1d0;
  Comparator *local_1c8;
  int local_1c0;
  stringstream local_1b8 [392];
  
  paVar1 = &local_218.field_2;
  while( true ) {
    local_1d0 = (FilterPolicy *)CONCAT71(local_1d0._1_7_,true);
    local_1c8 = (Comparator *)0x141127;
    local_1c0 = 0x2c6;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"foo","");
    local_218._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"v1","");
    pDVar3 = (this->super_DBTest).db_;
    local_241 = 0;
    local_1f8._24_8_ = local_240._M_dataplus._M_p;
    local_1f8._32_8_ = local_240._M_string_length;
    local_1f8._8_4_ = local_218._M_dataplus._M_p._0_4_;
    local_1f8._12_4_ = local_218._M_dataplus._M_p._4_4_;
    local_1f8._16_4_ = (undefined4)local_218._M_string_length;
    local_1f8._20_4_ = local_218._M_string_length._4_4_;
    (*pDVar3->_vptr_DB[2])(&local_220,pDVar3,&local_241,local_1f8 + 0x18,local_1f8 + 8);
    test::Tester::IsOk((Tester *)&local_1d0,&local_220);
    if (local_220.state_ != (char *)0x0) {
      operator_delete__(local_220.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (FilterPolicy *)0x141972;
    local_1c8 = (Comparator *)0x1;
    local_240._M_dataplus._M_p = "z";
    local_240._M_string_length = 1;
    pDVar3 = (this->super_DBTest).db_;
    (*pDVar3->_vptr_DB[0xb])(pDVar3,(Tester *)&local_1d0,&local_240);
    local_1d0 = (FilterPolicy *)CONCAT71(local_1d0._1_7_,true);
    local_1c8 = (Comparator *)0x141127;
    local_1c0 = 0x2c8;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_218._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"foo","");
    DBTest::Get(&local_240,&this->super_DBTest,&local_218,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v1",&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (FilterPolicy *)CONCAT71(local_1d0._1_7_,true);
    local_1c8 = (Comparator *)0x141127;
    local_1c0 = 0x2c9;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"foo","");
    local_218._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"v2","");
    pDVar3 = (this->super_DBTest).db_;
    local_241 = 0;
    local_1f8._24_8_ = local_240._M_dataplus._M_p;
    local_1f8._32_8_ = local_240._M_string_length;
    local_1f8._8_4_ = local_218._M_dataplus._M_p._0_4_;
    local_1f8._12_4_ = local_218._M_dataplus._M_p._4_4_;
    local_1f8._16_4_ = (undefined4)local_218._M_string_length;
    local_1f8._20_4_ = local_218._M_string_length._4_4_;
    (*pDVar3->_vptr_DB[2])(&local_220,pDVar3,&local_241,local_1f8 + 0x18,local_1f8 + 8);
    test::Tester::IsOk((Tester *)&local_1d0,&local_220);
    if (local_220.state_ != (char *)0x0) {
      operator_delete__(local_220.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (FilterPolicy *)CONCAT71(local_1d0._1_7_,true);
    local_1c8 = (Comparator *)0x141127;
    local_1c0 = 0x2ca;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_218._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"foo","");
    DBTest::Get(&local_240,&this->super_DBTest,&local_218,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v2",&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    DBImpl::TEST_CompactMemTable((DBImpl *)local_1f8);
    if ((_func_int **)local_1f8._0_8_ != (_func_int **)0x0) {
      operator_delete__((void *)local_1f8._0_8_);
    }
    local_1d0 = (FilterPolicy *)CONCAT71(local_1d0._1_7_,true);
    local_1c8 = (Comparator *)0x141127;
    local_1c0 = 0x2cc;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_218._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"foo","");
    DBTest::Get(&local_240,&this->super_DBTest,&local_218,(Snapshot *)0x0);
    test::Tester::IsEq<char[3],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [3])"v2",&local_240);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    iVar2 = (this->super_DBTest).option_config_;
    (this->super_DBTest).option_config_ = iVar2 + 1;
    if (2 < iVar2) break;
    DBTest::DestroyAndReopen(&this->super_DBTest,(Options *)0x0);
  }
  return;
}

Assistant:

TEST(DBTest, GetOrderedByLevels) {
  do {
    ASSERT_OK(Put("foo", "v1"));
    Compact("a", "z");
    ASSERT_EQ("v1", Get("foo"));
    ASSERT_OK(Put("foo", "v2"));
    ASSERT_EQ("v2", Get("foo"));
    dbfull()->TEST_CompactMemTable();
    ASSERT_EQ("v2", Get("foo"));
  } while (ChangeOptions());
}